

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O1

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer pAVar9;
  ulong uVar10;
  long lVar11;
  ArticulationParameter listElement;
  ArticulationParameter local_48;
  
  iVar2 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_munitionID);
  iVar4 = EventID::getMarshalledSize(&this->_eventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar6 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar7 = BurstDescriptor::getMarshalledSize(&this->_burstDescriptor);
  iVar8 = Vector3Float::getMarshalledSize(&this->_locationInEntityCoordinates);
  iVar2 = iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar8 + 4;
  pAVar9 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_articulationParameters).
      super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar9) {
    lVar11 = 8;
    uVar10 = 0;
    do {
      local_48._vptr_ArticulationParameter = (_func_int **)&PTR__ArticulationParameter_0019f588;
      puVar1 = (undefined8 *)((long)&pAVar9->_vptr_ArticulationParameter + lVar11);
      local_48._8_8_ = *puVar1;
      local_48._parameterValue = (double)puVar1[1];
      iVar3 = ArticulationParameter::getMarshalledSize(&local_48);
      iVar2 = iVar2 + iVar3;
      ArticulationParameter::~ArticulationParameter(&local_48);
      uVar10 = uVar10 + 1;
      pAVar9 = (this->_articulationParameters).
               super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x18;
    } while (uVar10 < (ulong)(((long)(this->_articulationParameters).
                                     super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar9 >> 3)
                             * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _munitionID.getMarshalledSize();  // _munitionID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _burstDescriptor.getMarshalledSize();  // _burstDescriptor
   marshalSize = marshalSize + _locationInEntityCoordinates.getMarshalledSize();  // _locationInEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfArticulationParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _articulationParameters.size(); idx++)
   {
        ArticulationParameter listElement = _articulationParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}